

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_DoublingFactorCounterTest_ThreeQuads_Test::testBody
          (TEST_DoublingFactorCounterTest_ThreeQuads_Test *this)

{
  PlayerHand *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  _Base_ptr p_Var4;
  UtestShell *pUVar5;
  char *pcVar6;
  char *pcVar7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  SimpleString local_b8;
  SimpleString local_b0;
  TestTerminatorWithoutExceptions local_a8;
  DoublingFactorReport r;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h;
  mahjong::PlayerHand::add(this_00,WestWind);
  mahjong::PlayerHand::add(this_00,WestWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addQuad
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,ThreeOfCharacters,false)
  ;
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addQuad
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,FourOfCircles,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addQuad
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,FiveOfBamboos,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,SevenOfCharacters,false)
  ;
  mahjong::WiningState::selfDrawn
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,
             (SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report
            (&r,&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  p_Var1 = &r.patterns._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = &p_Var1->_M_header;
  p_Var4 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    do {
      p_Var9 = p_Var4;
      p_Var11 = p_Var10;
      _Var2 = p_Var9[1]._M_color;
      p_Var10 = p_Var9;
      if ((int)_Var2 < 0x1e) {
        p_Var10 = p_Var11;
      }
      p_Var4 = (&p_Var9->_M_left)[(int)_Var2 < 0x1e];
    } while ((&p_Var9->_M_left)[(int)_Var2 < 0x1e] != (_Base_ptr)0x0);
    p_Var4 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      if ((int)_Var2 < 0x1e) {
        p_Var9 = p_Var11;
      }
      if ((int)p_Var9[1]._M_color < 0x1f) {
        pUVar5 = UtestShell::getCurrent();
        local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
        (*pUVar5->_vptr_UtestShell[0xe])
                  (pUVar5,0,0,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x19e,&local_b8);
        TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
                  ((TestTerminatorWithoutExceptions *)&local_b8);
        goto LAB_00169dc3;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var13;
      p_Var10 = p_Var4;
      iVar3 = (int)*(size_t *)(p_Var10 + 1);
      p_Var13 = p_Var10;
      if (iVar3 < 0x1e) {
        p_Var13 = &p_Var12->_M_header;
      }
      p_Var4 = (&p_Var10->_M_left)[iVar3 < 0x1e];
    } while ((&p_Var10->_M_left)[iVar3 < 0x1e] != (_Base_ptr)0x0);
    p_Var4 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var9 = &p_Var1->_M_header;
    p_Var8 = p_Var1;
    if ((_Rb_tree_header *)p_Var13 != p_Var1) {
      if (iVar3 < 0x1e) {
        p_Var10 = &p_Var12->_M_header;
      }
      p_Var8 = (_Rb_tree_header *)p_Var13;
      if (0x1e < (int)((_Rb_tree_header *)p_Var10)->_M_node_count) {
        p_Var8 = p_Var1;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var9;
      p_Var10 = p_Var4;
      iVar3 = (int)*(size_t *)(p_Var10 + 1);
      p_Var9 = p_Var10;
      if (iVar3 < 0x1e) {
        p_Var9 = &p_Var12->_M_header;
      }
      p_Var4 = (&p_Var10->_M_left)[iVar3 < 0x1e];
    } while ((&p_Var10->_M_left)[iVar3 < 0x1e] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var9 == p_Var1) {
      if (p_Var8 != p_Var1) goto LAB_00169cb5;
    }
    else {
      if (iVar3 < 0x1e) {
        p_Var10 = &p_Var12->_M_header;
      }
      if (0x1e < (int)((_Rb_tree_header *)p_Var10)->_M_node_count == (p_Var8 != p_Var1)) {
LAB_00169cb5:
        pUVar5 = UtestShell::getCurrent();
        (*pUVar5->_vptr_UtestShell[0x1b])
                  (pUVar5,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x19e);
      }
    }
  }
  pUVar5 = UtestShell::getCurrent();
  StringFrom((int)&local_b8);
  pcVar6 = SimpleString::asCharString(&local_b8);
  for (; r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0;
      r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&(r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
           [(int)r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_color <
            0x1e]) {
  }
  StringFrom((unsigned_long)&local_b0);
  pcVar7 = SimpleString::asCharString(&local_b0);
  local_a8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)&PTR_exitCurrentTest_001e18b8
  ;
  (*pUVar5->_vptr_UtestShell[0x16])
            (pUVar5,1,pcVar6,pcVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
             ,0x19e,&local_a8);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_b8);
LAB_00169dc3:
  if (r.doubling_factor == 2) {
    pUVar5 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x19f,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  else {
    pUVar5 = UtestShell::getCurrent();
    StringFrom((int)&local_b8);
    pcVar6 = SimpleString::asCharString(&local_b8);
    StringFrom((int)&local_b0);
    pcVar7 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x19f,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&r.patterns._M_t);
  if (r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(r.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&r.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&r);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeQuads)
{
	addPair(Tile::WestWind);
	addQuad(Tile::ThreeOfCharacters, false);
	addQuad(Tile::FourOfCircles, true);
	addQuad(Tile::FiveOfBamboos, true);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeQuads));
	CHECK_EQUAL(2, r.doubling_factor);
}